

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_expression
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  byte bVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  bool bVar4;
  shared_ptr<r_comp::RepliStruct> local_1d0;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [8];
  string s;
  shared_ptr<r_comp::RepliStruct> local_178;
  shared_ptr<r_comp::RepliStruct> local_168;
  shared_ptr<r_comp::RepliStruct> local_158;
  shared_ptr<r_comp::RepliStruct> local_148;
  shared_ptr<r_comp::RepliStruct> local_138;
  Class local_128;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar4 = read_nil(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar4) {
    this_local._7_1_ = 1;
    goto LAB_00199b18;
  }
  if ((pCStack_30 == (Class *)0x0) ||
     (bVar4 = std::operator!=(&pCStack_30->str_opcode,Class::Expression), !bVar4)) {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
    uVar3 = extent_index_local._6_2_;
    puVar2 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_128,ANY);
    bVar4 = read_variable(this,&local_e0,uVar3,puVar2,(bool)(bVar1 & 1),&local_128);
    Class::~Class(&local_128);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
    if (bVar4) {
      this_local._7_1_ = 1;
      goto LAB_00199b18;
    }
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_138,node);
    bVar4 = read_reference(this,&local_138,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1),
                           ANY);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_138);
    if (bVar4) {
      this_local._7_1_ = 1;
      goto LAB_00199b18;
    }
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    uVar3 = extent_index_local._6_2_;
    puVar2 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_c0,pCStack_30);
    bVar4 = read_variable(this,local_78,uVar3,puVar2,(bool)(bVar1 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar4) {
      this_local._7_1_ = 1;
      goto LAB_00199b18;
    }
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
    bVar4 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1),
                           pCStack_30->type);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
    if (bVar4) {
      this_local._7_1_ = 1;
      goto LAB_00199b18;
    }
  }
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_148,node);
  bVar4 = read_wildcard(this,&local_148,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_148);
  if (bVar4) {
    this_local._7_1_ = 1;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_158,node);
    bVar4 = read_tail_wildcard(this,&local_158,extent_index_local._6_2_,puStack_40,
                               (bool)(local_41 & 1));
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_158);
    if (bVar4) {
      this_local._7_1_ = 1;
    }
    else {
      if ((pCStack_30 == (Class *)0x0) ||
         (bVar4 = std::operator!=(&pCStack_30->str_opcode,Class::Expression), !bVar4)) {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_178,node);
        bVar4 = expression(this,&local_178,ANY,extent_index_local._6_2_,puStack_40,
                           (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_178);
        if (bVar4) {
          this_local._7_1_ = 1;
          goto LAB_00199b18;
        }
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_168,node);
        bVar4 = expression(this,&local_168,pCStack_30,extent_index_local._6_2_,puStack_40,
                           (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_168);
        if (bVar4) {
          this_local._7_1_ = 1;
          goto LAB_00199b18;
        }
      }
      if ((p_local._7_1_ & 1) == 0) {
        this_local._7_1_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_198," error: expected an expression",&local_199);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        if (pCStack_30 != (Class *)0x0) {
          std::__cxx11::string::operator+=(local_198," of type: ");
          std::__cxx11::string::operator+=(local_198,(string *)&pCStack_30->str_opcode);
          std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)node);
          std::operator+((char *)local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1caa03);
          std::__cxx11::string::operator+=(local_198,local_1c0);
          std::__cxx11::string::~string(local_1c0);
        }
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1d0,node);
        set_error(this,(string *)local_198,&local_1d0);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1d0);
        this_local._7_1_ = 0;
        std::__cxx11::string::~string(local_198);
      }
    }
  }
LAB_00199b18:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_expression(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil(node, write_index, extent_index, write)) {
        return true;
    }

    if (p && p->str_opcode != Class::Expression) {
        if (read_variable(node, write_index, extent_index, write, *p)) {
            return true;
        }

        if (read_reference(node, write_index, extent_index, write, p->type)) {
            return true;
        }
    } else {
        if (read_variable(node, write_index, extent_index, write, Class())) {
            return true;
        }

        if (read_reference(node, write_index, extent_index, write, ANY)) {
            return true;
        }
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (p && p->str_opcode != Class::Expression) {
        if (expression(node, *p, write_index, extent_index, write)) {
            return true;
        }
    } else if (expression(node, ANY, write_index, extent_index, write)) {
        return true;
    }

    if (enforce) {
        std::string s = " error: expected an expression";

        if (p) {
            s += " of type: ";
            s += p->str_opcode;
            s += " got: " + node->cmd;
        }

        set_error(s, node);
        return false;
    }

    return false;
}